

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O0

exr_result_t exr_attr_set_m33d(exr_context_t ctxt,int part_index,char *name,exr_attr_m33d_t *val)

{
  exr_result_t eVar1;
  char *in_RCX;
  exr_attribute_list_t *in_RDX;
  uint in_ESI;
  _internal_exr_context *in_RDI;
  exr_attribute_list_t *unaff_retaddr;
  exr_context_t in_stack_00000008;
  _internal_exr_part *part;
  _internal_exr_context *pctxt;
  exr_attribute_t **in_stack_00000020;
  exr_result_t rv;
  exr_attribute_t *attr;
  int local_34;
  exr_attribute_t **out;
  undefined4 in_stack_ffffffffffffffe8;
  _internal_exr_context *p_Var2;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  out = (exr_attribute_t **)0x0;
  if (in_RDI == (_internal_exr_context *)0x0) {
    local_34 = 2;
  }
  else {
    p_Var2 = in_RDI;
    internal_exr_lock(in_RDI);
    if (((int)in_ESI < 0) || (in_RDI->num_parts <= (int)in_ESI)) {
      internal_exr_unlock(in_RDI);
      local_34 = (*in_RDI->print_error)(in_RDI,4,"Part index (%d) out of range",(ulong)in_ESI);
    }
    else if (in_RDI->mode == '\0') {
      internal_exr_unlock(in_RDI);
      local_34 = (*in_RDI->standard_error)(in_RDI,8);
    }
    else if (in_RDI->mode == '\x03') {
      internal_exr_unlock(in_RDI);
      local_34 = (*in_RDI->standard_error)(in_RDI,0x15);
    }
    else {
      eVar1 = exr_attr_list_find_by_name
                        ((exr_const_context_t)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX,
                         in_RCX,out);
      if (eVar1 == 0xf) {
        if (in_RDI->mode != '\x01') {
          internal_exr_unlock(in_RDI);
          return 0xf;
        }
        local_34 = exr_attr_list_add(in_stack_00000008,unaff_retaddr,
                                     (char *)CONCAT44(in_stack_fffffffffffffffc,
                                                      in_stack_fffffffffffffff8),
                                     (exr_attribute_type_t)((ulong)p_Var2 >> 0x20),(int32_t)p_Var2,
                                     (uint8_t **)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                                     in_stack_00000020);
      }
      else {
        if (eVar1 != 0) {
          internal_exr_unlock(in_RDI);
          return eVar1;
        }
        local_34 = 0;
        if (*(int *)((long)out + 0x14) != 0xe) {
          internal_exr_unlock(in_RDI);
          eVar1 = (*in_RDI->print_error)
                            (in_RDI,0x10,
                             "\'%s\' requested type \'m33d\', but stored attributes is type \'%s\'",
                             in_RDX,out[1]);
          return eVar1;
        }
      }
      if (in_RCX == (char *)0x0) {
        internal_exr_unlock(in_RDI);
        local_34 = (*in_RDI->print_error)
                             (in_RDI,3,"No input value for setting \'%s\', type \'%s\'",in_RDX,
                              "m33d");
      }
      else {
        if (local_34 == 0) {
          memcpy(out[3],in_RCX,0x48);
        }
        internal_exr_unlock(in_RDI);
      }
    }
  }
  return local_34;
}

Assistant:

exr_result_t
exr_attr_set_m33d (
    exr_context_t          ctxt,
    int                    part_index,
    const char*            name,
    const exr_attr_m33d_t* val)
{
    ATTR_SET_IMPL_DEREF (EXR_ATTR_M33D, m33d);
}